

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::makeConst(Graph *this,Literal *value)

{
  bool bVar1;
  pointer ppVar2;
  Const *expr;
  Node *node;
  mapped_type *ppNVar3;
  Node *ret;
  Literal local_58;
  Const *local_40;
  Const *c;
  Builder builder;
  _Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true> local_28;
  iterator iter;
  Literal *value_local;
  Graph *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>.
  _M_cur = (_Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>)
           (_Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>)value;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Literal,_wasm::DataFlow::Node_*,_std::hash<wasm::Literal>,_std::equal_to<wasm::Literal>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>_>
       ::find(&this->constantNodes,value);
  builder.wasm = (Module *)
                 std::
                 unordered_map<wasm::Literal,_wasm::DataFlow::Node_*,_std::hash<wasm::Literal>,_std::equal_to<wasm::Literal>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>_>
                 ::end(&this->constantNodes);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_true>
                      *)&builder);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>,_false,_true>
                         *)&local_28);
    this_local = (Graph *)ppVar2->second;
  }
  else {
    Builder::Builder((Builder *)&c,this->module);
    wasm::Literal::Literal(&local_58,value);
    expr = Builder::makeConst((Builder *)&c,&local_58);
    wasm::Literal::~Literal(&local_58);
    local_40 = expr;
    node = Node::makeExpr((Expression *)expr,(Expression *)expr);
    this_local = (Graph *)addNode(this,node);
    ppNVar3 = std::
              unordered_map<wasm::Literal,_wasm::DataFlow::Node_*,_std::hash<wasm::Literal>,_std::equal_to<wasm::Literal>,_std::allocator<std::pair<const_wasm::Literal,_wasm::DataFlow::Node_*>_>_>
              ::operator[](&this->constantNodes,value);
    *ppNVar3 = (mapped_type)this_local;
  }
  return &this_local->bad;
}

Assistant:

Node* makeConst(Literal value) {
    auto iter = constantNodes.find(value);
    if (iter != constantNodes.end()) {
      return iter->second;
    }
    // Create one for this literal.
    Builder builder(*module);
    auto* c = builder.makeConst(value);
    auto* ret = addNode(Node::makeExpr(c, c));
    constantNodes[value] = ret;
    return ret;
  }